

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_examples.cpp
# Opt level: O2

void density_tests::func(size_t i_size)

{
  uint __line;
  undefined4 *puVar1;
  int *piVar2;
  char *__assertion;
  long in_FS_OFFSET;
  lifo_buffer buffer_2;
  lifo_buffer buffer_1;
  lifo_array<int> other_numbers;
  
  density::lifo_buffer::lifo_buffer(&buffer_1,i_size);
  if (buffer_1.m_size == i_size) {
    density::detail::ThreadLifoAllocator<0>::s_allocator::__tls_init();
    buffer_2.m_data = *(void **)(in_FS_OFFSET + -200);
    buffer_2.m_size = 0;
    puVar1 = (undefined4 *)density::lifo_buffer::resize(&buffer_2,4);
    if (puVar1 == (undefined4 *)buffer_2.m_data) {
      *puVar1 = 5;
      piVar2 = (int *)density::lifo_buffer::resize(&buffer_2,0x50);
      if (*piVar2 == 5) {
        other_numbers.super_LifoArrayImpl<int,_false>.m_elements =
             (int *)density::detail::ThreadLifoAllocator<0>::allocate(0x20);
        other_numbers.super_LifoArrayImpl<int,_false>.m_size = 7;
        density::detail::LifoArrayImpl<int,_false>::~LifoArrayImpl
                  (&other_numbers.super_LifoArrayImpl<int,_false>);
        density::lifo_buffer::~lifo_buffer(&buffer_2);
        density::lifo_buffer::~lifo_buffer(&buffer_1);
        return;
      }
      __assertion = "*static_cast<int *>(mem) == 5";
      __line = 0x36;
    }
    else {
      __assertion = "mem == buffer_2.data()";
      __line = 0x32;
    }
  }
  else {
    __assertion = "buffer_1.size() == i_size";
    __line = 0x2c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lifo_examples.cpp"
                ,__line,"void density_tests::func(size_t)");
}

Assistant:

void func(size_t i_size)
    {
        using namespace density;

        lifo_buffer buffer_1(i_size);
        assert(buffer_1.size() == i_size);

        lifo_buffer buffer_2; // now buffer_1 can't be resized until buffer_2 is destroyed
        assert(buffer_2.size() == 0);

        auto mem = buffer_2.resize(sizeof(int));
        assert(mem == buffer_2.data());
        *static_cast<int *>(mem) = 5;

        mem = buffer_2.resize(sizeof(int) * 20);
        assert(*static_cast<int *>(mem) == 5);

        lifo_array<int> other_numbers(7);
        // buffer_2.resize(20); <---- violation of the lifo constraint, other_numbers is more recent!
    }